

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile-record.c
# Opt level: O1

int big_file_write_records(BigFile *bf,BigRecordType *rtype,ptrdiff_t offset,size_t size,void *buf)

{
  int iVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  BigBlockPtr ptr;
  BigBlock block [1];
  BigArray array [1];
  BigBlockPtr local_2c8;
  BigBlock local_2a8;
  BigArray local_258;
  
  if (rtype->nfield != 0) {
    lVar3 = 0;
    uVar4 = 0;
    do {
      local_2c8.fileid = 0;
      local_2c8._4_4_ = 0;
      local_2c8.roffset = 0;
      local_2c8.aoffset = 0;
      iVar1 = big_record_view_field(rtype,(int)uVar4,&local_258,size,buf);
      if (iVar1 != 0) {
        iVar1 = 0xb0;
        goto LAB_0010b48c;
      }
      iVar1 = big_file_open_block(bf,&local_2a8,*(char **)(rtype->fields->dtype + lVar3 + -8));
      if (iVar1 != 0) {
        iVar1 = 0xb3;
        goto LAB_0010b48c;
      }
      iVar1 = big_block_seek(&local_2a8,&local_2c8,offset);
      if (iVar1 != 0) {
        iVar1 = 0xb6;
LAB_0010b462:
        _big_file_raise((char *)0x0,
                        "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile-record.c"
                        ,iVar1);
        iVar2 = big_block_close(&local_2a8);
        iVar1 = 0xc2;
        if (iVar2 == 0) {
          return -1;
        }
LAB_0010b48c:
        _big_file_raise((char *)0x0,
                        "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile-record.c"
                        ,iVar1);
        return -1;
      }
      iVar1 = big_block_write(&local_2a8,&local_2c8,&local_258);
      if (iVar1 != 0) {
        iVar1 = 0xb9;
        goto LAB_0010b462;
      }
      iVar1 = big_block_close(&local_2a8);
      if (iVar1 != 0) {
        iVar1 = 0xbc;
        goto LAB_0010b48c;
      }
      uVar4 = uVar4 + 1;
      lVar3 = lVar3 + 0x20;
    } while (uVar4 < rtype->nfield);
  }
  return 0;
}

Assistant:

int
big_file_write_records(BigFile * bf,
    const BigRecordType * rtype,
    ptrdiff_t offset,
    size_t size,
    const void * buf)
{
    int i;
    for(i = 0; i < rtype->nfield; i ++) {
        BigArray array[1];
        BigBlock block[1];
        BigBlockPtr ptr = {0};

        /* rainwoodman: cast away the const. We don't really modify it.*/
        RAISEIF(0 != big_record_view_field(rtype, i, array, size, (void*) buf),
            ex_array,
            NULL);
        RAISEIF(0 != big_file_open_block(bf, block, rtype->fields[i].name),
            ex_open,
            NULL);
        RAISEIF(0 != big_block_seek(block, &ptr, offset),
            ex_seek,
            NULL);
        RAISEIF(0 != big_block_write(block, &ptr, array),
            ex_write,
            NULL);
        RAISEIF(0 != big_block_close(block),
            ex_close,
            NULL);
        continue;
        ex_write:
        ex_seek:
            RAISEIF(0 != big_block_close(block),
            ex_close,
            NULL);
            return -1;
        ex_open:
        ex_close:
        ex_array:
            return -1;
    }
    return 0;
}